

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void grabMouseForWidget(QWidget *widget,QCursor *cursor)

{
  QWindow *pQVar1;
  
  if (qt_mouseGrb != (QWidget *)0x0) {
    QWidget::releaseMouse(qt_mouseGrb);
  }
  mouseGrabWithCursor = 0;
  pQVar1 = grabberWindow(widget);
  if (pQVar1 != (QWindow *)0x0) {
    if (cursor != (QCursor *)0x0) {
      mouseGrabWithCursor = 1;
      QGuiApplication::setOverrideCursor(cursor);
    }
    QWindow::setMouseGrabEnabled(SUB81(pQVar1,0));
  }
  qt_mouseGrb = widget;
  return;
}

Assistant:

static void grabMouseForWidget(QWidget *widget)
#endif
{
    if (qt_mouseGrb)
        qt_mouseGrb->releaseMouse();

    mouseGrabWithCursor = false;
    if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
        if (cursor) {
            mouseGrabWithCursor = true;
            QGuiApplication::setOverrideCursor(*cursor);
        }
#endif // !QT_NO_CURSOR
        window->setMouseGrabEnabled(true);
    }

    qt_mouseGrb = widget;
}